

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.h
# Opt level: O1

void __thiscall
Parfait::Octree<Parfait::Facet>::insert
          (Octree<Parfait::Facet> *this,int voxel_index,int object_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int voxel_index_00;
  pointer pNVar7;
  pointer pFVar8;
  iterator __position;
  int *piVar9;
  bool bVar10;
  ulong uVar11;
  undefined8 uVar12;
  Facet *this_00;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  Point<double> center;
  int local_6c;
  Point<double> local_68;
  undefined8 uStack_50;
  Point<double> local_48;
  
  uVar16 = (ulong)voxel_index;
  pNVar7 = (this->voxels).
           super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->voxels).
                  super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4) *
           0x6db6db6db6db6db7;
  uVar14 = uVar16;
  local_6c = object_index;
  if (uVar16 <= uVar11 && uVar11 - uVar16 != 0) {
    uVar14 = (ulong)object_index;
    pFVar8 = (this->objects).super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(this->objects).
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pFVar8 >> 5) * -0x5555555555555555;
    if (uVar14 <= uVar11 && uVar11 - uVar14 != 0) {
      dVar1 = *(double *)((long)&pNVar7[uVar16].extent.hi.pos + 0x10);
      dVar2 = *(double *)((long)&pNVar7[uVar16].extent.hi.pos + 8);
      dVar3 = pNVar7[uVar16].extent.hi.pos._M_elems[0];
      dVar4 = *(double *)((long)&pNVar7[uVar16].extent.lo.pos + 0x10);
      dVar5 = pNVar7[uVar16].extent.lo.pos._M_elems[0];
      dVar6 = *(double *)((long)&pNVar7[uVar16].extent.lo.pos + 8);
      this_00 = pFVar8 + uVar14;
      local_68.pos._M_elems[0] = (dVar3 + dVar5) * 0.5;
      local_68.pos._M_elems[1] = (dVar2 + dVar6) * 0.5;
      local_68.pos._M_elems[2] = (dVar1 + dVar4) * 0.5;
      local_48.pos._M_elems[0] = (dVar3 - dVar5) * 0.5;
      local_48.pos._M_elems[1] = (dVar2 - dVar6) * 0.5;
      local_48.pos._M_elems[2] = (dVar1 - dVar4) * 0.5;
      bVar10 = Facet::triBoxOverlap(this_00,&local_68,&local_48,&this_00->points);
      if (bVar10) {
        pNVar7 = (this->voxels).
                 super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = ((long)(this->voxels).
                        super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4) *
                 0x6db6db6db6db6db7;
        uVar14 = uVar16;
        if (uVar11 < uVar16 || uVar11 - uVar16 == 0) goto LAB_0010b90a;
        pNVar7[uVar16].filled = true;
        if (pNVar7[uVar16].children._M_elems[0] == -0xb) {
          lVar17 = 0;
          do {
            lVar13 = lVar17;
            if (lVar13 == 0x1c) goto LAB_0010b769;
            lVar17 = lVar13 + 4;
          } while (*(int *)((long)pNVar7[uVar16].children._M_elems + lVar13 + 4) == -0xb);
          if (lVar13 == 0x1c) {
LAB_0010b769:
            __position._M_current =
                 *(pointer *)
                  ((long)&pNVar7[uVar16].inside_objects.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
            if (__position._M_current ==
                *(pointer *)
                 ((long)&pNVar7[uVar16].inside_objects.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pNVar7[uVar16].inside_objects,
                         __position,&local_6c);
            }
            else {
              *__position._M_current = local_6c;
              *(int **)((long)&pNVar7[uVar16].inside_objects.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
                   __position._M_current + 1;
            }
            bVar10 = atMaxDepth(this,voxel_index);
            if (bVar10) {
              return;
            }
            local_68.pos._M_elems[0] = 0.0;
            local_68.pos._M_elems[1] = 0.0;
            local_68.pos._M_elems[2] = 0.0;
            pNVar7 = (this->voxels).
                     super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = ((long)(this->voxels).
                            super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4) *
                     0x6db6db6db6db6db7;
            if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar16);
            }
            std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::reserve
                      ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)&local_68,
                       (long)*(pointer *)
                              ((long)&pNVar7[uVar16].inside_objects.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                       *(long *)&pNVar7[uVar16].inside_objects.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2);
            pNVar7 = (this->voxels).
                     super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = ((long)(this->voxels).
                            super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4) *
                     0x6db6db6db6db6db7;
            if (uVar16 <= uVar14 && uVar14 - uVar16 != 0) {
              piVar15 = *(int **)&pNVar7[uVar16].inside_objects.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl;
              piVar9 = *(pointer *)
                        ((long)&pNVar7[uVar16].inside_objects.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
              if (piVar15 != piVar9) {
                do {
                  local_48.pos._M_elems[0] =
                       (double)((this->objects).
                                super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                                _M_impl.super__Vector_impl_data._M_start + *piVar15);
                  if (local_68.pos._M_elems[1] == local_68.pos._M_elems[2]) {
                    std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>::
                    _M_realloc_insert<Parfait::Facet*>
                              ((vector<Parfait::Facet*,std::allocator<Parfait::Facet*>> *)&local_68,
                               (iterator)local_68.pos._M_elems[1],(Facet **)&local_48);
                  }
                  else {
                    *(double *)local_68.pos._M_elems[1] = local_48.pos._M_elems[0];
                    local_68.pos._M_elems[1] = (double)((long)local_68.pos._M_elems[1] + 8);
                  }
                  piVar15 = piVar15 + 1;
                } while (piVar15 != piVar9);
              }
              if ((this->should_split).super__Function_base._M_manager != (_Manager_type)0x0) {
                bVar10 = (*(this->should_split)._M_invoker)
                                   ((_Any_data *)&this->should_split,
                                    (vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)
                                    &local_68);
                if (bVar10) {
                  splitVoxel(this,voxel_index);
                }
                if ((void *)local_68.pos._M_elems[0] == (void *)0x0) {
                  return;
                }
                operator_delete((void *)local_68.pos._M_elems[0],
                                (long)local_68.pos._M_elems[2] - (long)local_68.pos._M_elems[0]);
                return;
              }
              uVar12 = std::__throw_bad_function_call();
              if ((void *)local_68.pos._M_elems[0] != (void *)0x0) {
                operator_delete((void *)local_68.pos._M_elems[0],
                                (long)local_68.pos._M_elems[2] - (long)local_68.pos._M_elems[0]);
              }
              _Unwind_Resume(uVar12);
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar16);
          }
        }
        local_68.pos._M_elems[2] = *(double *)(pNVar7[uVar16].children._M_elems + 4);
        uStack_50 = *(undefined8 *)(pNVar7[uVar16].children._M_elems + 6);
        local_68.pos._M_elems[0] = *(double *)pNVar7[uVar16].children._M_elems;
        local_68.pos._M_elems[1] = *(double *)(pNVar7[uVar16].children._M_elems + 2);
        lVar17 = 0;
        do {
          voxel_index_00 = *(int *)((long)local_68.pos._M_elems + lVar17);
          if (voxel_index_00 != -0xb) {
            insert(this,voxel_index_00,local_6c);
          }
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x20);
      }
      return;
    }
  }
LAB_0010b90a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
             uVar11);
}

Assistant:

inline void insert(int voxel_index, int object_index) {
          const auto extent = voxels.at(voxel_index).extent;
          if(objects.at(object_index).intersects(extent)) {
              voxels.at(voxel_index).filled = true;
              if(voxels.at(voxel_index).isLeaf()) {
                  voxels.at(voxel_index).inside_objects.push_back(object_index);
                  if(not atMaxDepth(voxel_index)) {
                      std::vector<T*> inside;
                      inside.reserve(voxels.at(voxel_index).inside_objects.size());
                      for(auto i : voxels.at(voxel_index).inside_objects){
                          inside.push_back(&objects[i]);
                      }
                      if(should_split(inside)) {
                          splitVoxel(voxel_index);
                      }
                  }
              }
              else {
                  auto children = voxels.at(voxel_index).children;
                  for (auto child : children) {
                      if(child != Node::EMPTY)
                          insert(child, object_index);
                  }
              }
          }
      }